

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O3

void __thiscall
ThreadPool::add(ThreadPool *this,function<void_()> *task,function<void_()> *callback)

{
  pointer ppTVar1;
  ThreadTask *pTVar2;
  _Map_pointer ppTVar3;
  ThreadTask *pTVar4;
  _Map_pointer ppTVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  _Any_data local_50;
  code *local_40;
  _Any_data local_30;
  code *local_20;
  
  ppTVar1 = (this->_workers).super__Vector_base<ThreadTask_*,_std::allocator<ThreadTask_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  uVar7 = (long)(this->_workers).super__Vector_base<ThreadTask_*,_std::allocator<ThreadTask_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3;
  uVar8 = 0;
  if (1 < uVar7) {
    uVar9 = 1;
    do {
      pTVar2 = ppTVar1[uVar9];
      ppTVar3 = *(_Map_pointer *)((long)&(pTVar2->_taskQueue).c + 0x48);
      pTVar4 = ppTVar1[(int)uVar8];
      ppTVar5 = *(_Map_pointer *)((long)&(pTVar4->_taskQueue).c + 0x48);
      uVar6 = uVar9 & 0xffffffff;
      if ((int)((int)((ulong)((long)*(_Elt_pointer *)((long)&(pTVar4->_taskQueue).c + 0x20) -
                             (long)((iterator *)((long)&(pTVar4->_taskQueue).c + 0x10))->_M_cur) >>
                     6) + (int)((ulong)((long)((iterator *)((long)&(pTVar4->_taskQueue).c + 0x30))->
                                              _M_cur -
                                       (long)*(_Elt_pointer *)((long)&(pTVar4->_taskQueue).c + 0x38)
                                       ) >> 6) +
               (((int)ppTVar5 - *(int *)((long)&(pTVar4->_taskQueue).c + 0x28)) +
                (uint)(ppTVar5 != (_Map_pointer)0x0) * -8 & 0xfffffff8)) <=
          (int)((int)((ulong)((long)*(_Elt_pointer *)((long)&(pTVar2->_taskQueue).c + 0x20) -
                             (long)((iterator *)((long)&(pTVar2->_taskQueue).c + 0x10))->_M_cur) >>
                     6) + (int)((ulong)((long)((iterator *)((long)&(pTVar2->_taskQueue).c + 0x30))->
                                              _M_cur -
                                       (long)*(_Elt_pointer *)((long)&(pTVar2->_taskQueue).c + 0x38)
                                       ) >> 6) +
               (((int)ppTVar3 - *(int *)((long)&(pTVar2->_taskQueue).c + 0x28)) +
                (uint)(ppTVar3 != (_Map_pointer)0x0) * -8 & 0xfffffff8))) {
        uVar6 = uVar8;
      }
      uVar8 = uVar6;
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
    uVar8 = (ulong)(int)uVar8;
  }
  pTVar2 = ppTVar1[uVar8];
  std::function<void_()>::function((function<void_()> *)&local_30,task);
  std::function<void_()>::function((function<void_()> *)&local_50,callback);
  ThreadTask::add(pTVar2,(function<void_()> *)&local_30,(function<void_()> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void add(std::function<void()> task, std::function<void()> callback = nullptr)
	{
		int index = 0;
		for (int i = 1; i < _workers.size(); ++i)
		{
			if (_workers[i]->getSize() < _workers[index]->getSize())
				index = i;
		}
		_workers[index]->add(task, callback);
	}